

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::
swap_l<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::double_storage>
          (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
           *this,basic_json<char,_jsoncons::order_preserving_policy,_std::pmr::polymorphic_allocator<char>_>
                 *other)

{
  bool_storage bVar1;
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>> bVar2;
  byte bVar3;
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>> bVar4;
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>> bVar5;
  undefined4 uVar6;
  pointer phVar7;
  undefined8 uVar8;
  pointer phVar9;
  common_storage cVar10;
  void *__src;
  ulong uVar11;
  bool_storage temp;
  undefined1 auStack_26e [14];
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
  *pbStack_260;
  undefined1 auStack_22e [22];
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
  *pbStack_218;
  undefined1 auStack_1e6 [22];
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
  *pbStack_1d0;
  undefined1 auStack_19e [22];
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
  *pbStack_188;
  undefined1 auStack_156 [22];
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
  *pbStack_140;
  undefined1 auStack_10e [22];
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
  *pbStack_f8;
  undefined1 auStack_c6 [22];
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
  *pbStack_b0;
  undefined1 auStack_46 [22];
  
  bVar1 = (other->field_0).boolean_;
  switch((byte)bVar1 & 0xf) {
  case 0:
  case 4:
    cVar10 = (other->field_0).common_;
    phVar7 = *(pointer *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).long_str_.ptr_ = phVar7;
    goto LAB_007ae2c3;
  case 1:
    bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )(other->field_0).short_str_.data_[0];
    cVar10 = (other->field_0).common_;
    phVar7 = *(pointer *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).long_str_.ptr_ = phVar7;
    this[2] = bVar2;
LAB_007ae2c3:
    *(common_storage *)this = cVar10;
    break;
  default:
    uVar8 = *(undefined8 *)&other->field_0;
    phVar7 = (other->field_0).long_str_.ptr_;
    phVar9 = *(pointer *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).long_str_.ptr_ = phVar9;
    *(undefined8 *)this = uVar8;
    *(pointer *)(this + 8) = phVar7;
    break;
  case 6:
    uVar6 = *(undefined4 *)&other->field_0;
    phVar7 = *(pointer *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).long_str_.ptr_ = phVar7;
    *(undefined4 *)this = uVar6;
    break;
  case 7:
    bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )(other->field_0).common_.tag_;
    uVar11 = (ulong)((byte)bVar1 >> 4);
    memcpy(auStack_46,(void *)((long)&other->field_0 + 2),uVar11);
    auStack_46[uVar11] = 0;
    phVar7 = *(pointer *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).long_str_.ptr_ = phVar7;
    *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )bVar1;
    this[1] = bVar2;
    memcpy(this + 2,auStack_46,uVar11);
    this[uVar11 + 2] =
         (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>)
         0x0;
    break;
  case 10:
  case 0xb:
    bVar3 = *(byte *)&other->field_0;
    switch(bVar3 & 0xf) {
    case 0:
    case 4:
      cVar10 = (other->field_0).common_;
      bVar2 = *this;
      (other->field_0).boolean_ =
           (bool_storage)((byte)(other->field_0).boolean_ & 0xf0 | (byte)bVar2 & 0xf);
      bVar4 = *this;
      (other->field_0).boolean_ = (bool_storage)((byte)bVar4 & 0xf0 | (byte)bVar2 & 0xf);
      (other->field_0).common_.tag_ = (semantic_tag)this[1];
      memcpy((void *)((long)&other->field_0 + 2),this + 2,(ulong)((byte)*this >> 4));
      *(undefined1 *)((long)&other->field_0 + (ulong)((byte)bVar4 >> 4) + 2) = 0;
      *(common_storage *)this = cVar10;
      break;
    case 1:
      bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
               )(other->field_0).short_str_.data_[0];
      cVar10 = (other->field_0).common_;
      bVar4 = *this;
      (other->field_0).boolean_ = (bool_storage)(bVar3 & 0xf0 | (byte)bVar4 & 0xf);
      bVar5 = *this;
      (other->field_0).boolean_ = (bool_storage)((byte)bVar5 & 0xf0 | (byte)bVar4 & 0xf);
      (other->field_0).common_.tag_ = (semantic_tag)this[1];
      memcpy((void *)((long)&other->field_0 + 2),this + 2,(ulong)((byte)*this >> 4));
      *(undefined1 *)((long)&other->field_0 + (ulong)((byte)bVar5 >> 4) + 2) = 0;
      *(common_storage *)this = cVar10;
      this[2] = bVar2;
      break;
    default:
      uVar8 = *(undefined8 *)&other->field_0;
      phVar7 = (other->field_0).long_str_.ptr_;
      bVar2 = *this;
      (other->field_0).boolean_ = (bool_storage)(bVar3 & 0xf0 | (byte)bVar2 & 0xf);
      bVar4 = *this;
      (other->field_0).boolean_ = (bool_storage)((byte)bVar4 & 0xf0 | (byte)bVar2 & 0xf);
      (other->field_0).common_.tag_ = (semantic_tag)this[1];
      memcpy((void *)((long)&other->field_0 + 2),this + 2,(ulong)((byte)*this >> 4));
      *(undefined1 *)((long)&other->field_0 + (ulong)((byte)bVar4 >> 4) + 2) = 0;
      *(undefined8 *)this = uVar8;
      *(pointer *)(this + 8) = phVar7;
      break;
    case 6:
      uVar6 = *(undefined4 *)&other->field_0;
      bVar2 = *this;
      (other->field_0).boolean_ =
           (bool_storage)((byte)(other->field_0).boolean_ & 0xf0 | (byte)bVar2 & 0xf);
      bVar4 = *this;
      (other->field_0).boolean_ = (bool_storage)((byte)bVar4 & 0xf0 | (byte)bVar2 & 0xf);
      (other->field_0).common_.tag_ = (semantic_tag)this[1];
      memcpy((void *)((long)&other->field_0 + 2),this + 2,(ulong)((byte)*this >> 4));
      *(undefined1 *)((long)&other->field_0 + (ulong)((byte)bVar4 >> 4) + 2) = 0;
      *(undefined4 *)this = uVar6;
      break;
    case 7:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage>
                (this,other);
      return;
    case 10:
    case 0xb:
      bVar1 = (other->field_0).boolean_;
      pbStack_b0 = this;
      switch((byte)bVar1 & 0xf) {
      case 0:
      case 4:
        cVar10 = (other->field_0).common_;
        (other->field_0).boolean_ = (bool_storage)0xf;
        (other->field_0).common_.tag_ = (semantic_tag)this[1];
        (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
        goto LAB_007ae617;
      case 1:
        bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )(other->field_0).short_str_.data_[0];
        cVar10 = (other->field_0).common_;
        (other->field_0).boolean_ = (bool_storage)0xf;
        (other->field_0).common_.tag_ = (semantic_tag)this[1];
        (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
        this[2] = bVar2;
LAB_007ae617:
        *(common_storage *)this = cVar10;
        break;
      default:
        uVar8 = *(undefined8 *)&other->field_0;
        phVar7 = (other->field_0).long_str_.ptr_;
        (other->field_0).boolean_ = (bool_storage)0xf;
        (other->field_0).common_.tag_ = (semantic_tag)this[1];
        (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
        *(undefined8 *)this = uVar8;
        *(pointer *)(this + 8) = phVar7;
        break;
      case 6:
        uVar6 = *(undefined4 *)&other->field_0;
        (other->field_0).boolean_ = (bool_storage)0xf;
        (other->field_0).common_.tag_ = (semantic_tag)this[1];
        (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
        *(undefined4 *)this = uVar6;
        break;
      case 7:
        bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )(other->field_0).common_.tag_;
        uVar11 = (ulong)((byte)bVar1 >> 4);
        memcpy(auStack_c6,(void *)((long)&other->field_0 + 2),uVar11);
        auStack_c6[uVar11] = 0;
        (other->field_0).boolean_ = (bool_storage)0xf;
        (other->field_0).common_.tag_ = (semantic_tag)this[1];
        (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
        *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )bVar1;
        this[1] = bVar2;
        memcpy(this + 2,auStack_c6,uVar11);
        this[uVar11 + 2] =
             (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
              )0x0;
        break;
      case 10:
      case 0xb:
        bVar1 = (other->field_0).boolean_;
        pbStack_f8 = this;
        switch((byte)bVar1 & 0xf) {
        case 0:
        case 4:
          cVar10 = (other->field_0).common_;
          (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
          (other->field_0).common_.tag_ = (semantic_tag)this[1];
          (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
          goto LAB_007ae7ab;
        case 1:
          bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )(other->field_0).short_str_.data_[0];
          cVar10 = (other->field_0).common_;
          (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
          (other->field_0).common_.tag_ = (semantic_tag)this[1];
          (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
          this[2] = bVar2;
LAB_007ae7ab:
          *(common_storage *)this = cVar10;
          break;
        default:
          uVar8 = *(undefined8 *)&other->field_0;
          phVar7 = (other->field_0).long_str_.ptr_;
          (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
          (other->field_0).common_.tag_ = (semantic_tag)this[1];
          (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
          *(undefined8 *)this = uVar8;
          *(pointer *)(this + 8) = phVar7;
          break;
        case 6:
          uVar6 = *(undefined4 *)&other->field_0;
          (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
          (other->field_0).common_.tag_ = (semantic_tag)this[1];
          (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
          *(undefined4 *)this = uVar6;
          break;
        case 7:
          bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )(other->field_0).common_.tag_;
          uVar11 = (ulong)((byte)bVar1 >> 4);
          memcpy(auStack_10e,(void *)((long)&other->field_0 + 2),uVar11);
          auStack_10e[uVar11] = 0;
          (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
          (other->field_0).common_.tag_ = (semantic_tag)this[1];
          (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
          *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )bVar1;
          this[1] = bVar2;
          memcpy(this + 2,auStack_10e,uVar11);
          this[uVar11 + 2] =
               (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                )0x0;
          break;
        case 10:
        case 0xb:
          bVar1 = (other->field_0).boolean_;
          pbStack_140 = this;
          switch((byte)bVar1 & 0xf) {
          case 0:
          case 4:
            cVar10 = (other->field_0).common_;
            (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
            (other->field_0).common_.tag_ = (semantic_tag)this[1];
            (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
            goto LAB_007ae943;
          case 1:
            bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                     )(other->field_0).short_str_.data_[0];
            cVar10 = (other->field_0).common_;
            (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
            (other->field_0).common_.tag_ = (semantic_tag)this[1];
            (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
            this[2] = bVar2;
LAB_007ae943:
            *(common_storage *)this = cVar10;
            break;
          default:
            uVar8 = *(undefined8 *)&other->field_0;
            phVar7 = (other->field_0).long_str_.ptr_;
            (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
            (other->field_0).common_.tag_ = (semantic_tag)this[1];
            (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
            *(undefined8 *)this = uVar8;
            *(pointer *)(this + 8) = phVar7;
            break;
          case 6:
            uVar6 = *(undefined4 *)&other->field_0;
            (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
            (other->field_0).common_.tag_ = (semantic_tag)this[1];
            (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
            *(undefined4 *)this = uVar6;
            break;
          case 7:
            bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                     )(other->field_0).common_.tag_;
            uVar11 = (ulong)((byte)bVar1 >> 4);
            memcpy(auStack_156,(void *)((long)&other->field_0 + 2),uVar11);
            auStack_156[uVar11] = 0;
            (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
            (other->field_0).common_.tag_ = (semantic_tag)this[1];
            (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
            *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                     )bVar1;
            this[1] = bVar2;
            memcpy(this + 2,auStack_156,uVar11);
            this[uVar11 + 2] =
                 (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                  )0x0;
            break;
          case 10:
          case 0xb:
            bVar1 = (other->field_0).boolean_;
            pbStack_188 = this;
            switch((byte)bVar1 & 0xf) {
            case 0:
            case 4:
              cVar10 = (other->field_0).common_;
              (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
              (other->field_0).common_.tag_ = (semantic_tag)this[1];
              (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
              goto LAB_007aeadb;
            case 1:
              bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                       )(other->field_0).short_str_.data_[0];
              cVar10 = (other->field_0).common_;
              (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
              (other->field_0).common_.tag_ = (semantic_tag)this[1];
              (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
              this[2] = bVar2;
LAB_007aeadb:
              *(common_storage *)this = cVar10;
              break;
            default:
              uVar8 = *(undefined8 *)&other->field_0;
              phVar7 = (other->field_0).long_str_.ptr_;
              (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
              (other->field_0).common_.tag_ = (semantic_tag)this[1];
              (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
              *(undefined8 *)this = uVar8;
              *(pointer *)(this + 8) = phVar7;
              break;
            case 6:
              uVar6 = *(undefined4 *)&other->field_0;
              (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
              (other->field_0).common_.tag_ = (semantic_tag)this[1];
              (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
              *(undefined4 *)this = uVar6;
              break;
            case 7:
              bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                       )(other->field_0).common_.tag_;
              uVar11 = (ulong)((byte)bVar1 >> 4);
              memcpy(auStack_19e,(void *)((long)&other->field_0 + 2),uVar11);
              auStack_19e[uVar11] = 0;
              (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
              (other->field_0).common_.tag_ = (semantic_tag)this[1];
              (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
              *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                       )bVar1;
              this[1] = bVar2;
              memcpy(this + 2,auStack_19e,uVar11);
              this[uVar11 + 2] =
                   (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                    )0x0;
              break;
            case 10:
            case 0xb:
              bVar1 = (other->field_0).boolean_;
              pbStack_1d0 = this;
              switch((byte)bVar1 & 0xf) {
              case 0:
              case 4:
                cVar10 = (other->field_0).common_;
                phVar7 = *(pointer *)(this + 8);
                *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                (other->field_0).long_str_.ptr_ = phVar7;
                goto LAB_007aec13;
              case 1:
                bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                         )(other->field_0).short_str_.data_[0];
                cVar10 = (other->field_0).common_;
                phVar7 = *(pointer *)(this + 8);
                *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                (other->field_0).long_str_.ptr_ = phVar7;
                this[2] = bVar2;
LAB_007aec13:
                *(common_storage *)this = cVar10;
                break;
              default:
                uVar8 = *(undefined8 *)&other->field_0;
                phVar7 = (other->field_0).long_str_.ptr_;
                phVar9 = *(pointer *)(this + 8);
                *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                (other->field_0).long_str_.ptr_ = phVar9;
                *(undefined8 *)this = uVar8;
                *(pointer *)(this + 8) = phVar7;
                break;
              case 6:
                uVar6 = *(undefined4 *)&other->field_0;
                phVar7 = *(pointer *)(this + 8);
                *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                (other->field_0).long_str_.ptr_ = phVar7;
                *(undefined4 *)this = uVar6;
                break;
              case 7:
                bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                         )(other->field_0).common_.tag_;
                uVar11 = (ulong)((byte)bVar1 >> 4);
                memcpy(auStack_1e6,(void *)((long)&other->field_0 + 2),uVar11);
                auStack_1e6[uVar11] = 0;
                phVar7 = *(pointer *)(this + 8);
                *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                (other->field_0).long_str_.ptr_ = phVar7;
                *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                         )bVar1;
                this[1] = bVar2;
                memcpy(this + 2,auStack_1e6,uVar11);
                this[uVar11 + 2] =
                     (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                      )0x0;
                break;
              case 10:
              case 0xb:
                bVar1 = (other->field_0).boolean_;
                pbStack_218 = this;
                switch((byte)bVar1 & 0xf) {
                case 0:
                case 4:
                  cVar10 = (other->field_0).common_;
                  phVar7 = *(pointer *)(this + 8);
                  *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                  (other->field_0).long_str_.ptr_ = phVar7;
                  goto LAB_007aed3b;
                case 1:
                  bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                           )(other->field_0).short_str_.data_[0];
                  cVar10 = (other->field_0).common_;
                  phVar7 = *(pointer *)(this + 8);
                  *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                  (other->field_0).long_str_.ptr_ = phVar7;
                  this[2] = bVar2;
LAB_007aed3b:
                  *(common_storage *)this = cVar10;
                  break;
                default:
                  uVar8 = *(undefined8 *)&other->field_0;
                  phVar7 = (other->field_0).long_str_.ptr_;
                  phVar9 = *(pointer *)(this + 8);
                  *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                  (other->field_0).long_str_.ptr_ = phVar9;
                  *(undefined8 *)this = uVar8;
                  *(pointer *)(this + 8) = phVar7;
                  break;
                case 6:
                  uVar6 = *(undefined4 *)&other->field_0;
                  phVar7 = *(pointer *)(this + 8);
                  *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                  (other->field_0).long_str_.ptr_ = phVar7;
                  *(undefined4 *)this = uVar6;
                  break;
                case 7:
                  bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                           )(other->field_0).common_.tag_;
                  uVar11 = (ulong)((byte)bVar1 >> 4);
                  memcpy(auStack_22e,(void *)((long)&other->field_0 + 2),uVar11);
                  auStack_22e[uVar11] = 0;
                  phVar7 = *(pointer *)(this + 8);
                  *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                  (other->field_0).long_str_.ptr_ = phVar7;
                  *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                           )bVar1;
                  this[1] = bVar2;
                  memcpy(this + 2,auStack_22e,uVar11);
                  this[uVar11 + 2] =
                       (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                        )0x0;
                  break;
                case 10:
                case 0xb:
                  bVar1 = (other->field_0).boolean_;
                  bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                           )(other->field_0).common_.tag_;
                  __src = (void *)((long)&other->field_0 + 2);
                  uVar11 = (ulong)((byte)bVar1 >> 4);
                  pbStack_260 = this;
                  memcpy(auStack_26e,__src,uVar11);
                  auStack_26e[uVar11] = 0;
                  bVar4 = *this;
                  (other->field_0).boolean_ = (bool_storage)((byte)bVar1 & 0xf0 | (byte)bVar4 & 0xf)
                  ;
                  bVar5 = *this;
                  (other->field_0).boolean_ = (bool_storage)((byte)bVar5 & 0xf0 | (byte)bVar4 & 0xf)
                  ;
                  (other->field_0).common_.tag_ = (semantic_tag)this[1];
                  memcpy(__src,this + 2,(ulong)((byte)*this >> 4));
                  *(undefined1 *)((long)&other->field_0 + (ulong)((byte)bVar5 >> 4) + 2) = 0;
                  *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                           )bVar1;
                  this[1] = bVar2;
                  memcpy(this + 2,auStack_26e,uVar11);
                  this[uVar11 + 2] =
                       (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                        )0x0;
                  return;
                case 0xc:
                case 0xd:
                case 0xe:
                  bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                           )(other->field_0).common_.tag_;
                  phVar7 = (other->field_0).long_str_.ptr_;
                  phVar9 = *(pointer *)(this + 8);
                  *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                  (other->field_0).long_str_.ptr_ = phVar9;
                  *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                           )((byte)bVar1 & 0xf);
                  this[1] = bVar2;
                  *(pointer *)(this + 8) = phVar7;
                  break;
                case 0xf:
                  bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                           )(other->field_0).common_.tag_;
                  phVar7 = (other->field_0).long_str_.ptr_;
                  phVar9 = *(pointer *)(this + 8);
                  *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                  (other->field_0).long_str_.ptr_ = phVar9;
                  *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                           )0xf;
                  this[1] = bVar2;
                  *(pointer *)(this + 8) = phVar7;
                }
                return;
              case 0xc:
              case 0xd:
              case 0xe:
                bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                         )(other->field_0).common_.tag_;
                phVar7 = (other->field_0).long_str_.ptr_;
                phVar9 = *(pointer *)(this + 8);
                *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                (other->field_0).long_str_.ptr_ = phVar9;
                *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                         )((byte)bVar1 & 0xf);
                this[1] = bVar2;
                *(pointer *)(this + 8) = phVar7;
                break;
              case 0xf:
                bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                         )(other->field_0).common_.tag_;
                phVar7 = (other->field_0).long_str_.ptr_;
                phVar9 = *(pointer *)(this + 8);
                *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                (other->field_0).long_str_.ptr_ = phVar9;
                *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                         )0xf;
                this[1] = bVar2;
                *(pointer *)(this + 8) = phVar7;
              }
              return;
            case 0xc:
            case 0xd:
            case 0xe:
              bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                       )(other->field_0).common_.tag_;
              phVar7 = (other->field_0).long_str_.ptr_;
              (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
              (other->field_0).common_.tag_ = (semantic_tag)this[1];
              (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
              *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                       )((byte)bVar1 & 0xf);
              this[1] = bVar2;
              *(pointer *)(this + 8) = phVar7;
              break;
            case 0xf:
              bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                       )(other->field_0).common_.tag_;
              phVar7 = (other->field_0).long_str_.ptr_;
              (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
              (other->field_0).common_.tag_ = (semantic_tag)this[1];
              (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
              *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                       )0xf;
              this[1] = bVar2;
              *(pointer *)(this + 8) = phVar7;
            }
            return;
          case 0xc:
          case 0xd:
          case 0xe:
            bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                     )(other->field_0).common_.tag_;
            phVar7 = (other->field_0).long_str_.ptr_;
            (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
            (other->field_0).common_.tag_ = (semantic_tag)this[1];
            (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
            *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                     )((byte)bVar1 & 0xf);
            this[1] = bVar2;
            *(pointer *)(this + 8) = phVar7;
            break;
          case 0xf:
            bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                     )(other->field_0).common_.tag_;
            phVar7 = (other->field_0).long_str_.ptr_;
            (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
            (other->field_0).common_.tag_ = (semantic_tag)this[1];
            (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
            *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                     )0xf;
            this[1] = bVar2;
            *(pointer *)(this + 8) = phVar7;
          }
          return;
        case 0xc:
        case 0xd:
        case 0xe:
          bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )(other->field_0).common_.tag_;
          phVar7 = (other->field_0).long_str_.ptr_;
          (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
          (other->field_0).common_.tag_ = (semantic_tag)this[1];
          (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
          *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )((byte)bVar1 & 0xf);
          this[1] = bVar2;
          *(pointer *)(this + 8) = phVar7;
          break;
        case 0xf:
          bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )(other->field_0).common_.tag_;
          phVar7 = (other->field_0).long_str_.ptr_;
          (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
          (other->field_0).common_.tag_ = (semantic_tag)this[1];
          (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
          *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )0xf;
          this[1] = bVar2;
          *(pointer *)(this + 8) = phVar7;
        }
        return;
      case 0xc:
      case 0xd:
      case 0xe:
        bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )(other->field_0).common_.tag_;
        phVar7 = (other->field_0).long_str_.ptr_;
        (other->field_0).boolean_ = (bool_storage)0xf;
        (other->field_0).common_.tag_ = (semantic_tag)this[1];
        (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
        *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )((byte)bVar1 & 0xf);
        this[1] = bVar2;
        *(pointer *)(this + 8) = phVar7;
        break;
      case 0xf:
        bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )(other->field_0).common_.tag_;
        phVar7 = (other->field_0).long_str_.ptr_;
        (other->field_0).boolean_ = (bool_storage)0xf;
        (other->field_0).common_.tag_ = (semantic_tag)this[1];
        (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
        *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )0xf;
        this[1] = bVar2;
        *(pointer *)(this + 8) = phVar7;
      }
      return;
    case 0xc:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::byte_string_storage>
                (this,other);
      return;
    case 0xd:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::object_storage>
                (this,other);
      return;
    case 0xe:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::array_storage>
                (this,other);
      return;
    case 0xf:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::long_string_storage>
                (this,other);
      return;
    }
    return;
  case 0xc:
  case 0xd:
  case 0xe:
    bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )(other->field_0).common_.tag_;
    phVar7 = (other->field_0).long_str_.ptr_;
    phVar9 = *(pointer *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).long_str_.ptr_ = phVar9;
    *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )((byte)bVar1 & 0xf);
    this[1] = bVar2;
    *(pointer *)(this + 8) = phVar7;
    break;
  case 0xf:
    bVar2 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )(other->field_0).common_.tag_;
    phVar7 = (other->field_0).long_str_.ptr_;
    phVar9 = *(pointer *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).long_str_.ptr_ = phVar9;
    *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )0xf;
    this[1] = bVar2;
    *(pointer *)(this + 8) = phVar7;
  }
  return;
}

Assistant:

void swap_l(basic_json& other) noexcept
        {
            switch (other.storage_kind())
            {
                case json_storage_kind::null         : swap_l_r<TypeL, null_storage>(other); break;
                case json_storage_kind::empty_object : swap_l_r<TypeL, empty_object_storage>(other); break;
                case json_storage_kind::boolean         : swap_l_r<TypeL, bool_storage>(other); break;
                case json_storage_kind::int64        : swap_l_r<TypeL, int64_storage>(other); break;
                case json_storage_kind::uint64       : swap_l_r<TypeL, uint64_storage>(other); break;
                case json_storage_kind::half_float         : swap_l_r<TypeL, half_storage>(other); break;
                case json_storage_kind::float64       : swap_l_r<TypeL, double_storage>(other); break;
                case json_storage_kind::short_str : swap_l_r<TypeL, short_string_storage>(other); break;
                case json_storage_kind::long_str  : swap_l_r<TypeL, long_string_storage>(other); break;
                case json_storage_kind::byte_str  : swap_l_r<TypeL, byte_string_storage>(other); break;
                case json_storage_kind::array        : swap_l_r<TypeL, array_storage>(other); break;
                case json_storage_kind::object       : swap_l_r<TypeL, object_storage>(other); break;
                case json_storage_kind::json_const_reference : swap_l_r<TypeL, json_const_reference_storage>(other); break;
                case json_storage_kind::json_reference : swap_l_r<TypeL, json_reference_storage>(other); break;
                default:
                    JSONCONS_UNREACHABLE();
                    break;
            }
        }